

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O2

bool __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
::_negative_vine_swap
          (RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
           *this,Index columnIndex)

{
  Index negativeSimplexIndex;
  Pos_index PVar1;
  Pos_index PVar2;
  
  PVar1 = _get_birth(this,columnIndex);
  negativeSimplexIndex = columnIndex + 1;
  PVar2 = _get_birth(this,negativeSimplexIndex);
  _add_to(this,columnIndex,negativeSimplexIndex);
  _swap_at_index(this,columnIndex);
  if (PVar1 < PVar2) {
    _negative_transpose(this,columnIndex);
  }
  else {
    _add_to(this,columnIndex,negativeSimplexIndex);
  }
  return PVar1 < PVar2;
}

Assistant:

inline bool RU_vine_swap<Master_matrix>::_negative_vine_swap(Index columnIndex) 
{
  const Pos_index iBirth = _get_birth(columnIndex);
  const Pos_index iiBirth = _get_birth(columnIndex + 1);

  _add_to(columnIndex, columnIndex + 1);
  _swap_at_index(columnIndex);

  if (iBirth < iiBirth) {
    _negative_transpose(columnIndex);
    return true;
  }

  _add_to(columnIndex, columnIndex + 1);

  return false;
}